

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiOldColumns *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiWindow *pIVar4;
  ImGuiOldColumnData *pIVar5;
  float fVar6;
  float _y;
  float fVar7;
  float x_1;
  int n_1;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiOldColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiOldColumnFlags flags;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined1 in_stack_ffffffffffffff63;
  ImGuiID in_stack_ffffffffffffff64;
  ImDrawList *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  float idx;
  int in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  ImVec2 local_78;
  float in_stack_ffffffffffffff90;
  ImU32 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff9c;
  bool *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  ImDrawList *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int i;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar9;
  bool local_1d;
  
  pIVar4 = GetCurrentWindow();
  pIVar2 = (pIVar4->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge
              ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  uVar1 = pIVar2->Flags;
  fVar6 = ImMax<float>(pIVar2->LineMaxY,(pIVar4->DC).CursorPos.y);
  pIVar2->LineMaxY = fVar6;
  (pIVar4->DC).CursorPos.y = pIVar2->LineMaxY;
  if ((uVar1 & 0x10) == 0) {
    (pIVar4->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  local_1d = false;
  if (((uVar1 & 1) == 0) && ((pIVar4->SkipItems & 1U) == 0)) {
    fVar6 = ImMax<float>(pIVar2->HostCursorPosY,(pIVar4->ClipRect).Min.y);
    _y = ImMin<float>((pIVar4->DC).CursorPos.y,(pIVar4->ClipRect).Max.y);
    iVar9 = -1;
    for (i = 1; i < pIVar2->Count; i = i + 1) {
      ImVector<ImGuiOldColumnData>::operator[](&pIVar2->Columns,i);
      idx = (pIVar4->Pos).x;
      fVar7 = GetColumnOffset(in_stack_ffffffffffffff70);
      fVar7 = idx + fVar7;
      id = pIVar2->ID + i;
      uVar8 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,fVar7 - 4.0,fVar6);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,fVar7 + 4.0,_y);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffac,(ImVec2 *)&stack0xffffffffffffffa4,
                     (ImVec2 *)&stack0xffffffffffffff9c);
      KeepAliveID(id);
      bVar3 = IsClippedEx((ImRect *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          (bool)in_stack_ffffffffffffff63);
      if (!bVar3) {
        if ((uVar1 & 2) == 0) {
          ButtonBehavior((ImRect *)CONCAT44(uVar8,in_stack_ffffffffffffffb8),
                         (ImGuiID)in_stack_ffffffffffffffb4,
                         (bool *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,(ImGuiButtonFlags)in_stack_ffffffffffffff9c);
        }
        in_stack_ffffffffffffff70 = 0x1b;
        in_stack_ffffffffffffff94 = GetColorU32((ImGuiCol)idx,3.78351e-44);
        in_stack_ffffffffffffff90 = (float)(int)fVar7;
        in_stack_ffffffffffffff68 = pIVar4->DrawList;
        ImVec2::ImVec2(&local_78,in_stack_ffffffffffffff90,fVar6 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,in_stack_ffffffffffffff90,_y);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(fVar7,id),
                            (ImVec2 *)CONCAT44(uVar8,in_stack_ffffffffffffffb8),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (ImU32)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
    }
    if (iVar9 != -1) {
      if ((pIVar2->IsBeingResized & 1U) == 0) {
        for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff7c < pIVar2->Count + 1;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
          pIVar5 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar2->Columns,in_stack_ffffffffffffff7c);
          fVar6 = pIVar5->OffsetNorm;
          pIVar5 = ImVector<ImGuiOldColumnData>::operator[]
                             (&pIVar2->Columns,in_stack_ffffffffffffff7c);
          pIVar5->OffsetNormBeforeResize = fVar6;
        }
      }
      local_1d = true;
      pIVar2->IsBeingResized = true;
      GetDraggedColumnOffset((ImGuiOldColumns *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
      ;
      SetColumnOffset(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    }
  }
  pIVar2->IsBeingResized = local_1d;
  (pIVar4->WorkRect).Min = (pIVar4->ParentWorkRect).Min;
  (pIVar4->WorkRect).Max = (pIVar4->ParentWorkRect).Max;
  (pIVar4->ParentWorkRect).Min = (pIVar2->HostBackupParentWorkRect).Min;
  (pIVar4->ParentWorkRect).Max = (pIVar2->HostBackupParentWorkRect).Max;
  (pIVar4->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar4->DC).ColumnsOffset.x = 0.0;
  (pIVar4->DC).CursorPos.x =
       (float)(int)((pIVar4->Pos).x + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}